

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O0

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmTextureCalc::GetMipMapByteAddress
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  uint uVar1;
  GMM_YUV_PLANE GVar2;
  GMM_RESOURCE_TYPE GVar3;
  GMM_GFX_SIZE_T GVar4;
  uint8_t uVar5;
  GMM_PLATFORM_INFO *pGVar6;
  uint local_78;
  GMM_GFX_SIZE_T local_70;
  uint local_5c;
  uint32_t CubeFace;
  uint32_t OffsetY;
  uint32_t OffsetX;
  uint32_t Plane;
  GMM_PLATFORM_INFO *pPlatform;
  uint32_t MipLevel;
  GMM_GFX_SIZE_T Pitch;
  GMM_GFX_SIZE_T MipMapByteAddress;
  GMM_GFX_SIZE_T ArrayQPitch;
  GMM_REQ_OFFSET_INFO *pReqInfo_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local = (GmmTextureCalc *)0x1;
  }
  else if (pReqInfo == (GMM_REQ_OFFSET_INFO *)0x0) {
    this_local = (GmmTextureCalc *)0x1;
  }
  else {
    uVar1 = pReqInfo->MipLevel;
    GVar4 = pTexInfo->Pitch;
    if (((undefined1  [96])*pReqInfo & (undefined1  [96])0x1) == (undefined1  [96])0x0) {
      local_70 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch;
    }
    else {
      local_70 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0];
    }
    MipMapByteAddress = local_70;
    pGVar6 = GmmGetPlatformInfo(this->pGmmLibContext);
    if ((pTexInfo->Type == RESOURCE_3D) && (((ulong)(pTexInfo->Flags).Info >> 0x13 & 1) == 0)) {
      MipMapByteAddress = pGVar6->TileInfo[pTexInfo->TileMode].LogicalTileDepth * local_70;
    }
    if ((((10 < (int)(pGVar6->Platform).eRenderCoreFamily) && (1 < (pTexInfo->MSAA).NumSamples)) &&
        (((ulong)(pTexInfo->Flags).Gpu >> 6 & 1) == 0)) &&
       (((((ulong)(pTexInfo->Flags).Gpu >> 0x1d & 1) == 0 &&
         (((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0)) &&
        ((((ulong)(pTexInfo->Flags).Info >> 0x2c & 1) == 0 &&
         (((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) == 0)))))) {
      MipMapByteAddress = (pTexInfo->MSAA).NumSamples * MipMapByteAddress;
    }
    uVar5 = GmmIsPlanar(pTexInfo->Format);
    if (uVar5 == '\0') {
      GVar3 = pTexInfo->Type;
      if (GVar3 - RESOURCE_1D < 2) {
        Pitch = *(GMM_GFX_SIZE_T *)(pTexInfo->MmcHint + (ulong)uVar1 * 8 + 0x80);
        if (pReqInfo->ArrayIndex != 0) {
          Pitch = MipMapByteAddress * pReqInfo->ArrayIndex + Pitch;
        }
      }
      else if (GVar3 == RESOURCE_3D) {
        if ((int)(pGVar6->Platform).eRenderCoreFamily < 0xc) {
          Pitch = Get3DMipByteAddress(this,pTexInfo,pReqInfo);
        }
        else {
          Pitch = *(GMM_GFX_SIZE_T *)(pTexInfo->MmcHint + (ulong)uVar1 * 8 + 0x80);
          if (pReqInfo->Slice != 0) {
            Pitch = MipMapByteAddress * pReqInfo->Slice + Pitch;
          }
        }
      }
      else if (GVar3 == RESOURCE_CUBE) {
        Pitch = MipMapByteAddress * (pReqInfo->ArrayIndex * 6 + pReqInfo->CubeFace) +
                *(long *)(pTexInfo->MmcHint + (ulong)uVar1 * 8 + 0x80);
      }
      else {
        Pitch = 0;
      }
    }
    else {
      GVar2 = pReqInfo->Plane;
      CubeFace = 0;
      local_5c = 0;
      if (GVar2 < GMM_MAX_PLANE) {
        CubeFace = (uint32_t)*(undefined8 *)(pTexInfo->MmcHint + (ulong)GVar2 * 8 + 0x78);
        local_5c = (uint)*(undefined8 *)
                          ((long)&(pTexInfo->OffsetInfo).field_0 + (ulong)GVar2 * 8 + 0x28);
        MipMapByteAddress = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch;
      }
      Pitch = MipMapByteAddress * pReqInfo->ArrayIndex + local_5c * GVar4 + (ulong)CubeFace;
    }
    if (((ulong)(pTexInfo->Flags).Gpu & 0x1000000) == 0) {
      local_78 = 0;
    }
    else {
      local_78 = GetDisplayFrameOffset(this,pTexInfo,pReqInfo);
    }
    this_local = (GmmTextureCalc *)(local_78 + Pitch);
  }
  return (GMM_GFX_SIZE_T)this_local;
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmTextureCalc::GetMipMapByteAddress(GMM_TEXTURE_INFO *   pTexInfo,
                                                            GMM_REQ_OFFSET_INFO *pReqInfo)
{
    GMM_GFX_SIZE_T ArrayQPitch, MipMapByteAddress, Pitch;
    uint32_t       MipLevel;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);
    __GMM_ASSERT(!(pTexInfo->Flags.Gpu.CCS && !pTexInfo->Flags.Gpu.UnifiedAuxSurface));
    __GMM_ASSERT(pReqInfo->Plane < GMM_MAX_PLANE);

    MipLevel    = pReqInfo->MipLevel;
    Pitch       = pTexInfo->Pitch;
    ArrayQPitch = pReqInfo->ReqRender ?
                  pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender :
                  pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    if(pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear)
    {
        ArrayQPitch *= pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileDepth;
    }

    if((GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE) &&
       ((pTexInfo->MSAA.NumSamples > 1) &&
        !(pTexInfo->Flags.Gpu.Depth ||
          pTexInfo->Flags.Gpu.SeparateStencil ||
          GMM_IS_64KB_TILE(pTexInfo->Flags) ||
          pTexInfo->Flags.Info.TiledYf)))
    {
        ArrayQPitch *= pTexInfo->MSAA.NumSamples;
    }

    if(GmmIsPlanar(pTexInfo->Format))
    {
        uint32_t Plane = pReqInfo->Plane;

        uint32_t OffsetX = 0;
        uint32_t OffsetY = 0;
        if(Plane < GMM_MAX_PLANE)
        {
            OffsetX     = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.X[Plane]);
            OffsetY     = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.Y[Plane]);
            ArrayQPitch = pTexInfo->OffsetInfo.Plane.ArrayQPitch;
	}
        MipMapByteAddress = (OffsetY * Pitch) + OffsetX;

        __GMM_ASSERT(!pReqInfo->ArrayIndex || (pReqInfo->ArrayIndex < pTexInfo->ArraySize));

        MipMapByteAddress += (ArrayQPitch * pReqInfo->ArrayIndex);
    }
    else
    {
        switch(pTexInfo->Type)
        {
            case RESOURCE_CUBE:
            {
                uint32_t CubeFace = pReqInfo->CubeFace;

                GMM_ASSERTDPF( // Validate Cube Map Params...
                (!pReqInfo->ArrayIndex || (pReqInfo->ArrayIndex < pTexInfo->ArraySize)) &&
                (pReqInfo->CubeFace < __GMM_MAX_CUBE_FACE) &&
                (pReqInfo->CubeFace != __GMM_NO_CUBE_MAP) &&
                (pReqInfo->Plane == GMM_NO_PLANE) &&
                (pReqInfo->Slice == 0),
                "Invalid parameter!");

                // Support for CubeMap Arrays using 2D Arrays
                MipMapByteAddress = pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[MipLevel];
                MipMapByteAddress += (ArrayQPitch * ((6 * pReqInfo->ArrayIndex) + CubeFace));
                break;
            }
            case RESOURCE_2D:
            case RESOURCE_1D:
            {
                MipMapByteAddress = pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[MipLevel];

                if(pReqInfo->ArrayIndex)
                {
                    MipMapByteAddress += (ArrayQPitch * pReqInfo->ArrayIndex);
                }
                break;
            }
            case RESOURCE_3D:
            {
                if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE)
                {
                    MipMapByteAddress = pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[MipLevel];

                    if(pReqInfo->Slice)
                    {
                        MipMapByteAddress += (ArrayQPitch * pReqInfo->Slice);
                    }
                }
                else
                {
                    MipMapByteAddress = Get3DMipByteAddress(pTexInfo, pReqInfo);
                }
                break;
            }
            default:
            { // These resources don't have multiple levels of detail
                MipMapByteAddress = 0;
                break;
            }
        }
    }

    MipMapByteAddress += pTexInfo->Flags.Gpu.S3d ?
                         GetDisplayFrameOffset(pTexInfo, pReqInfo) :
                         0;

    return MipMapByteAddress;
}